

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void bfgs_iter_start<sparse_parameters>
               (vw *all,bfgs *b,float *mem,int *lastj,double importance_weight_sum,int *origin,
               sparse_parameters *weights)

{
  float fVar1;
  float fVar2;
  long lVar3;
  bool bVar4;
  uint32_t uVar5;
  char *pcVar6;
  float *pfVar7;
  undefined4 *in_RCX;
  int __c;
  long in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  long in_RDI;
  int *in_R8;
  sparse_parameters *in_R9;
  double in_XMM0_Qa;
  iterator iVar8;
  float *mem1;
  iterator w;
  double g1_g1;
  double g1_Hg1;
  sparse_iterator<float> *in_stack_ffffffffffffff28;
  sparse_parameters *in_stack_ffffffffffffff30;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_78;
  uint32_t local_70;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_68;
  uint32_t local_60;
  sparse_iterator<float> local_58;
  double local_48;
  double local_40;
  sparse_parameters *local_38;
  int *local_30;
  double local_28;
  undefined4 *local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_40 = 0.0;
  local_48 = 0.0;
  *in_R8 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar8 = sparse_parameters::begin(in_stack_ffffffffffffff30);
  local_68._M_cur =
       (__node_type *)
       iVar8._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_60 = iVar8._stride;
  local_58._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_68._M_cur;
  local_58._stride = local_60;
  while( true ) {
    iVar8 = sparse_parameters::end(in_stack_ffffffffffffff30);
    local_78._M_cur =
         (__node_type *)
         iVar8._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_70 = iVar8._stride;
    __s = &local_78;
    bVar4 = sparse_iterator<float>::operator!=
                      ((sparse_iterator<float> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
                      );
    lVar3 = local_18;
    if (!bVar4) break;
    pcVar6 = sparse_iterator<float>::index(&local_58,(char *)__s,__c);
    uVar5 = sparse_parameters::stride_shift(local_38);
    in_stack_ffffffffffffff30 =
         (sparse_parameters *)
         (lVar3 + ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
    if (0 < *(int *)(local_10 + 8)) {
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a1a1);
      *(float *)((long)&(in_stack_ffffffffffffff30->_map)._M_h._M_buckets +
                (long)((*local_30 + 1) % *(int *)(local_10 + 0xb4)) * 4) = *pfVar7;
    }
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a1e5);
    *(float *)((long)&(in_stack_ffffffffffffff30->_map)._M_h._M_buckets +
              (long)(*local_30 % *(int *)(local_10 + 0xb4)) * 4) = pfVar7[1];
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a22a);
    fVar1 = pfVar7[1];
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a246);
    fVar2 = pfVar7[1];
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a26c);
    local_40 = (double)fVar1 * (double)fVar2 * (double)pfVar7[3] + local_40;
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a2a2);
    fVar1 = pfVar7[1];
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a2be);
    local_48 = (double)fVar1 * (double)pfVar7[1] + local_48;
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a2f4);
    fVar1 = pfVar7[3];
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a319);
    fVar2 = pfVar7[1];
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a337);
    pfVar7[2] = -fVar1 * fVar2;
    pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28a34f);
    pfVar7[1] = 0.0;
    sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_ffffffffffffff30);
  }
  *local_20 = 0;
  if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
    fprintf(_stderr,"%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t",local_48 / (local_28 * local_28),
            local_40 / local_28,"","");
  }
  return;
}

Assistant:

void bfgs_iter_start(vw& all, bfgs& b, float* mem, int& lastj, double importance_weight_sum, int& origin, T& weights)
{
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  origin = 0;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    if (b.m > 0)
      mem1[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    mem1[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * ((&(*w))[W_GT]) * ((&(*w))[W_COND]);
    g1_g1 += ((double)((&(*w))[W_GT])) * ((&(*w))[W_GT]);
    (&(*w))[W_DIR] = -(&(*w))[W_COND] * ((&(*w))[W_GT]);
    ((&(*w))[W_GT]) = 0;
  }
  lastj = 0;
  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, "", "", "");
}